

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O1

void absl::RemoveExtraAsciiWhitespace(string *str)

{
  ulong uVar1;
  byte *pbVar2;
  char *in_RDX;
  byte *pbVar3;
  pointer pcVar4;
  ulong extraout_RDX;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  byte *pbVar9;
  char *pcVar10;
  byte bVar11;
  string_view sVar12;
  
  sVar12._M_str = in_RDX;
  sVar12._M_len = (size_t)(str->_M_dataplus)._M_p;
  sVar12 = StripLeadingAsciiWhitespace((absl *)str->_M_string_length,sVar12);
  pbVar3 = (byte *)sVar12._M_str;
  uVar1 = sVar12._M_len;
  pbVar2 = pbVar3 + uVar1;
  pbVar9 = pbVar2;
  if (0 < (long)uVar1 >> 2) {
    pbVar9 = pbVar3 + ((uint)sVar12._M_len & 3);
    lVar5 = ((long)uVar1 >> 2) + 1;
    do {
      if ((ascii_internal::kPropertyBits[pbVar2[-1]] & 8) == 0) goto LAB_00104fb4;
      if ((ascii_internal::kPropertyBits[pbVar2[-2]] & 8) == 0) {
        pbVar2 = pbVar2 + -1;
        goto LAB_00104fb4;
      }
      if ((ascii_internal::kPropertyBits[pbVar2[-3]] & 8) == 0) {
        pbVar2 = pbVar2 + -2;
        goto LAB_00104fb4;
      }
      if ((ascii_internal::kPropertyBits[pbVar2[-4]] & 8) == 0) {
        pbVar2 = pbVar2 + -3;
        goto LAB_00104fb4;
      }
      pbVar2 = pbVar2 + -4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar9 - (long)pbVar3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar2 = pbVar3;
      if ((lVar5 != 3) || (pbVar2 = pbVar9, (ascii_internal::kPropertyBits[pbVar9[-1]] & 8) == 0))
      goto LAB_00104fb4;
      pbVar9 = pbVar9 + -1;
    }
    pbVar2 = pbVar9;
    if ((ascii_internal::kPropertyBits[pbVar9[-1]] & 8) == 0) goto LAB_00104fb4;
    pbVar9 = pbVar9 + -1;
  }
  pbVar2 = pbVar9;
  if ((ascii_internal::kPropertyBits[pbVar9[-1]] & 8) != 0) {
    pbVar2 = pbVar3;
  }
LAB_00104fb4:
  uVar6 = (long)pbVar2 - (long)pbVar3;
  if (uVar1 < (ulong)((long)pbVar2 - (long)pbVar3)) {
    uVar6 = uVar1;
  }
  if (uVar6 == 0) {
    str->_M_string_length = 0;
    pcVar4 = (str->_M_dataplus)._M_p;
  }
  else {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    if (0 < (long)uVar6) {
      pbVar9 = pbVar3 + uVar6;
      bVar8 = 0;
      do {
        bVar11 = (ascii_internal::kPropertyBits[*pbVar3] & 8) >> 3;
        pbVar2[-(ulong)(bVar8 & bVar11)] = *pbVar3;
        pbVar2 = pbVar2 + -(ulong)(bVar8 & bVar11) + 1;
        pbVar3 = pbVar3 + 1;
        bVar8 = bVar11;
      } while (pbVar3 < pbVar9);
    }
    pcVar4 = (str->_M_dataplus)._M_p;
    uVar1 = (long)pbVar2 - (long)pcVar4;
    if (str->_M_string_length < uVar1) {
      pcVar10 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar7 = "basic_string::erase";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar1);
      if (extraout_RDX < 0x10) {
        if (extraout_RDX != 0) {
          uVar1 = 0;
          do {
            pcVar10[uVar1] = ((byte)(pcVar7[uVar1] + 0xbfU) < 0x1a) << 5 ^ pcVar7[uVar1];
            uVar1 = uVar1 + 1;
          } while (extraout_RDX != uVar1);
        }
      }
      else {
        uVar1 = 0;
        do {
          pcVar10[uVar1] = ((char)(pcVar7[uVar1] + 0x3fU) < -0x66) << 5 ^ pcVar7[uVar1];
          uVar1 = uVar1 + 1;
        } while (extraout_RDX != uVar1);
      }
      return;
    }
    str->_M_string_length = uVar1;
    pcVar4 = pcVar4 + uVar1;
  }
  *pcVar4 = '\0';
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(std::string* absl_nonnull str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}